

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

double log_uniform_pdf(double x,double a,double b)

{
  double dVar1;
  double dVar2;
  undefined8 local_28;
  double pdf;
  double b_local;
  double a_local;
  double x_local;
  
  if (a <= x) {
    if (b < x) {
      local_28 = 0.0;
    }
    else {
      dVar1 = log(b);
      dVar2 = log(a);
      local_28 = 1.0 / (x * (dVar1 - dVar2));
    }
  }
  else {
    local_28 = 0.0;
  }
  return local_28;
}

Assistant:

double log_uniform_pdf ( double x, double a, double b )

//****************************************************************************80
//
//  Purpose:
//
//    LOG_UNIFORM_PDF evaluates the Log Uniform PDF.
//
//  Discussion:
//
//    PDF(A,B;X) = ( log ( B ) - log ( A ) ) / X  for A <= X <= B
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    20 September 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double X, the argument of the PDF.
//
//    Input, double A, B, the parameters of the PDF.
//    1.0 < A < B.
//
//    Output, double PDF, the value of the PDF.
//
{
  double pdf;

  if ( x < a )
  {
    pdf = 0.0;
  }
  else if ( x <= b )
  {
    pdf = 1.0 / ( x * ( log ( b ) - log ( a ) ) );
  }
  else
  {
    pdf = 0.0;
  }

  return pdf;
}